

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solbase.h
# Opt level: O1

SolBase<double> * __thiscall
soplex::SolBase<double>::operator=
          (SolBase<double> *this,
          SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          *sol)

{
  byte bVar1;
  double result;
  double local_20;
  
  if ((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)this != sol) {
    this->field_0x98 = this->field_0x98 & 0xfe | sol->field_0xd0 & 1;
    VectorBase<double>::operator=(&this->_primal,&sol->_primal);
    VectorBase<double>::operator=(&this->_slacks,&sol->_slacks);
    local_20 = 0.0;
    boost::multiprecision::detail::
    generic_convert_rational_to_float<double,boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>>
              (&local_20,&(sol->_objVal).m_backend);
    this->_objVal = local_20;
    bVar1 = sol->field_0xd0 & 2;
    this->field_0x98 = this->field_0x98 & 0xfd | bVar1;
    if (bVar1 != 0) {
      VectorBase<double>::operator=(&this->_primalRay,&sol->_primalRay);
    }
    this->field_0x98 = this->field_0x98 & 0xfb | sol->field_0xd0 & 4;
    VectorBase<double>::operator=(&this->_dual,&sol->_dual);
    VectorBase<double>::operator=(&this->_redCost,&sol->_redCost);
    bVar1 = sol->field_0xd0 & 8;
    this->field_0x98 = this->field_0x98 & 0xf7 | bVar1;
    if (bVar1 != 0) {
      VectorBase<double>::operator=(&this->_dualFarkas,&sol->_dualFarkas);
    }
  }
  return this;
}

Assistant:

SolBase<R>& operator=(const SolBase<S>& sol)
   {
      if((SolBase<S>*)this != &sol)
      {

         _isPrimalFeasible = sol._isPrimalFeasible;
         _primal = sol._primal;
         _slacks = sol._slacks;

         _objVal = R(sol._objVal);

         _hasPrimalRay = sol._hasPrimalRay;

         if(_hasPrimalRay)
            _primalRay = sol._primalRay;

         _isDualFeasible = sol._isDualFeasible;
         _dual = sol._dual;
         _redCost = sol._redCost;

         _hasDualFarkas = sol._hasDualFarkas;

         if(_hasDualFarkas)
            _dualFarkas = sol._dualFarkas;
      }

      return *this;
   }